

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_string.cpp
# Opt level: O3

string * duckdb::ConvertToString::Operation<duckdb::string_t>(string_t input)

{
  undefined1 *puVar1;
  undefined1 *in_RDX;
  uint in_ESI;
  string *in_RDI;
  undefined1 auStack_14 [12];
  
  puVar1 = auStack_14;
  if (0xc < in_ESI) {
    puVar1 = in_RDX;
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,puVar1,puVar1 + in_ESI);
  return in_RDI;
}

Assistant:

string ConvertToString::Operation(string_t input) {
	return input.GetString();
}